

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ext_dma.c
# Opt level: O0

MPP_RET allocator_ext_dma_release(void *ctx,MppBufferInfo *info)

{
  MppBufferInfo *info_local;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx",
                 "allocator_ext_dma_release",0x77), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((info->size == 0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->size",
                 "allocator_ext_dma_release",0x78), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (info->ptr != (void *)0x0) {
    munmap(info->ptr,info->size);
  }
  info->ptr = (void *)0x0;
  info->hnd = (void *)0x0;
  info->fd = -1;
  info->size = 0;
  return MPP_OK;
}

Assistant:

static MPP_RET allocator_ext_dma_release(void *ctx, MppBufferInfo *info)
{
    mpp_assert(ctx);
    mpp_assert(info->size);

    if (info->ptr)
        munmap(info->ptr, info->size);

    info->ptr   = NULL;
    info->hnd   = NULL;
    info->fd    = -1;
    info->size  = 0;

    return MPP_OK;
}